

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_1,_0>::calcRootLogLikelihoodsByPartition
          (BeagleCPU4StateImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  int iVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int *piVar10;
  double **ppdVar11;
  double **ppdVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  piVar10 = (this->super_BeagleCPUImpl<double,_1,_0>).gPatternPartitionsStartPatterns;
  ppdVar11 = (this->super_BeagleCPUImpl<double,_1,_0>).gCategoryWeights;
  ppdVar12 = (this->super_BeagleCPUImpl<double,_1,_0>).gPartials;
  iVar7 = (this->super_BeagleCPUImpl<double,_1,_0>).kCategoryCount;
  for (uVar18 = 0; uVar18 != (uint)(~(partitionCount >> 0x1f) & partitionCount); uVar18 = uVar18 + 1
      ) {
    lVar23 = 0;
    iVar8 = piVar10[partitionIndices[uVar18]];
    iVar9 = piVar10[(long)partitionIndices[uVar18] + 1];
    pdVar13 = ppdVar12[bufferIndices[uVar18]];
    pdVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
    pdVar15 = ppdVar11[categoryWeightsIndices[uVar18]];
    iVar1 = iVar8 * 4;
    dVar2 = *pdVar15;
    for (iVar19 = iVar8; iVar19 < iVar9; iVar19 = iVar19 + 1) {
      pdVar14[iVar1 + lVar23] = dVar2 * pdVar13[iVar1 + lVar23];
      pdVar14[(long)iVar1 + lVar23 + 1] = dVar2 * pdVar13[(long)iVar1 + lVar23 + 1];
      pdVar14[(long)iVar1 + lVar23 + 2] = dVar2 * pdVar13[(long)iVar1 + lVar23 + 2];
      pdVar14[(long)iVar1 + lVar23 + 3] = dVar2 * pdVar13[(long)iVar1 + lVar23 + 3];
      lVar23 = lVar23 + 4;
    }
    iVar19 = (this->super_BeagleCPUImpl<double,_1,_0>).kExtraPatterns;
    iVar22 = (int)lVar23 + iVar1;
    iVar20 = ((iVar8 - iVar9) + (this->super_BeagleCPUImpl<double,_1,_0>).kPatternCount) * 4;
    for (lVar23 = 1; lVar23 < iVar7; lVar23 = lVar23 + 1) {
      auVar24._8_8_ = 0;
      auVar24._0_8_ = pdVar15[lVar23];
      pdVar14 = (this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp;
      lVar16 = (long)(iVar20 + iVar22);
      lVar17 = 0;
      iVar21 = iVar8;
      while (iVar21 < iVar9) {
        auVar25._8_8_ = 0;
        auVar25._0_8_ = pdVar13[lVar16 + lVar17];
        iVar21 = iVar21 + 1;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = pdVar14[iVar1 + lVar17];
        auVar3 = vfmadd213sd_fma(auVar25,auVar24,auVar3);
        pdVar14[iVar1 + lVar17] = auVar3._0_8_;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = pdVar13[lVar16 + lVar17 + 1];
        auVar4._8_8_ = 0;
        auVar4._0_8_ = pdVar14[(long)iVar1 + lVar17 + 1];
        auVar3 = vfmadd213sd_fma(auVar26,auVar24,auVar4);
        pdVar14[(long)iVar1 + lVar17 + 1] = auVar3._0_8_;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = pdVar13[lVar16 + lVar17 + 2];
        auVar5._8_8_ = 0;
        auVar5._0_8_ = pdVar14[(long)iVar1 + lVar17 + 2];
        auVar3 = vfmadd213sd_fma(auVar27,auVar24,auVar5);
        pdVar14[(long)iVar1 + lVar17 + 2] = auVar3._0_8_;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = pdVar13[lVar16 + lVar17 + 3];
        auVar6._8_8_ = 0;
        auVar6._0_8_ = pdVar14[(long)iVar1 + lVar17 + 3];
        auVar3 = vfmadd213sd_fma(auVar28,auVar24,auVar6);
        pdVar14[(long)iVar1 + lVar17 + 3] = auVar3._0_8_;
        lVar17 = lVar17 + 4;
      }
      iVar22 = (int)lVar17 + iVar22 + iVar20 + iVar19 * 4;
    }
  }
  integrateOutStatesAndScaleByPartition
            (this,(this->super_BeagleCPUImpl<double,_1,_0>).integrationTmp,stateFrequenciesIndices,
             cumulativeScaleIndices,partitionIndices,partitionCount,outSumLogLikelihoodByPartition);
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition(
                                                                    const int* bufferIndices,
                                                                    const int* categoryWeightsIndices,
                                                                    const int* stateFrequenciesIndices,
                                                                    const int* cumulativeScaleIndices,
                                                                    const int* partitionIndices,
                                                                    int partitionCount,
                                                                    double* outSumLogLikelihoodByPartition) {


    for (int p = 0; p < partitionCount; p++) {
        int pIndex = partitionIndices[p];

        int startPattern = gPatternPartitionsStartPatterns[pIndex];
        int endPattern = gPatternPartitionsStartPatterns[pIndex + 1];

        const REALTYPE* rootPartials = gPartials[bufferIndices[p]];
        assert(rootPartials);
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[p]];

        int v = startPattern * 4;
        const REALTYPE wt0 = wt[0];
        for (int k = startPattern; k < endPattern; k++) {
            integrationTmp[v    ] = rootPartials[v    ] * wt0;
            integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
            integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
            integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
            v += 4;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            int u = startPattern * 4;
            v += ((kPatternCount - endPattern) + startPattern) * 4;
            const REALTYPE wtl = wt[l];
            for (int k = startPattern; k < endPattern; k++) {
                integrationTmp[u    ] += rootPartials[v    ] * wtl;
                integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
                integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
                integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

                u += 4;
                v += 4;
            }
        v += 4 * kExtraPatterns;
        }
    }
    integrateOutStatesAndScaleByPartition(integrationTmp, stateFrequenciesIndices, cumulativeScaleIndices, partitionIndices, partitionCount, outSumLogLikelihoodByPartition);
}